

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

void __thiscall
nuraft::raft_server::get_srv_config_all
          (raft_server *this,
          vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
          *configs_out)

{
  bool bVar1;
  element_type *this_00;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *this_01;
  iterator this_02;
  reference __x;
  shared_ptr<nuraft::srv_config> *entry;
  iterator __end1;
  iterator __begin1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *__range1;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *servers;
  ptr<cluster_config> c_conf;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  *this_03;
  _Self in_stack_ffffffffffffffb8;
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
  local_20;
  
  this_03 = &local_20;
  get_config((raft_server *)in_stack_ffffffffffffffb8._M_node);
  this_00 = std::
            __shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<nuraft::cluster_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x25288a);
  this_01 = cluster_config::get_servers_abi_cxx11_(this_00);
  std::__cxx11::
  list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>::
  begin(this_03);
  this_02 = std::__cxx11::
            list<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
            ::end(this_03);
  while( true ) {
    bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffb8,(_Self *)&stack0xffffffffffffffb0);
    if (!bVar1) break;
    __x = std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator*
                    ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)this_01);
    std::
    vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
    ::push_back((vector<std::shared_ptr<nuraft::srv_config>,_std::allocator<std::shared_ptr<nuraft::srv_config>_>_>
                 *)this_02._M_node,__x);
    std::_List_iterator<std::shared_ptr<nuraft::srv_config>_>::operator++
              ((_List_iterator<std::shared_ptr<nuraft::srv_config>_> *)&stack0xffffffffffffffb8);
  }
  std::shared_ptr<nuraft::cluster_config>::~shared_ptr
            ((shared_ptr<nuraft::cluster_config> *)0x252932);
  return;
}

Assistant:

void raft_server::get_srv_config_all
     ( std::vector< ptr<srv_config> >& configs_out ) const
{
    ptr<cluster_config> c_conf = get_config();
    auto& servers = c_conf->get_servers();
    for (auto& entry: servers) configs_out.push_back(entry);
}